

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void intra_copy_frame_mvs(AV1_COMMON *cm,int mi_row,int mi_col,int x_mis,int y_mis)

{
  int iVar1;
  int w;
  MV_REF *mv;
  int h;
  MV_REF *frame_mvs;
  int frame_mvs_stride;
  int y_mis_local;
  int x_mis_local;
  int mi_col_local;
  int mi_row_local;
  AV1_COMMON *cm_local;
  
  iVar1 = (cm->mi_params).mi_cols + 1 >> 1;
  frame_mvs = cm->cur_frame->mvs + (long)((mi_row >> 1) * iVar1) + (long)(mi_col >> 1);
  for (h = 0; h < y_mis + 1 >> 1; h = h + 1) {
    mv = frame_mvs;
    for (w = 0; w < x_mis + 1 >> 1; w = w + 1) {
      mv->ref_frame = -1;
      mv = mv + 1;
    }
    frame_mvs = frame_mvs + iVar1;
  }
  return;
}

Assistant:

static void intra_copy_frame_mvs(AV1_COMMON *const cm, int mi_row, int mi_col,
                                 int x_mis, int y_mis) {
  const int frame_mvs_stride = ROUND_POWER_OF_TWO(cm->mi_params.mi_cols, 1);
  MV_REF *frame_mvs =
      cm->cur_frame->mvs + (mi_row >> 1) * frame_mvs_stride + (mi_col >> 1);
  x_mis = ROUND_POWER_OF_TWO(x_mis, 1);
  y_mis = ROUND_POWER_OF_TWO(y_mis, 1);

  for (int h = 0; h < y_mis; h++) {
    MV_REF *mv = frame_mvs;
    for (int w = 0; w < x_mis; w++) {
      mv->ref_frame = NONE_FRAME;
      mv++;
    }
    frame_mvs += frame_mvs_stride;
  }
}